

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

Cluster * __thiscall
cnn::HierarchicalSoftmaxBuilder::ReadClusterFile
          (HierarchicalSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  char *pcVar1;
  char cVar2;
  uint *puVar3;
  size_type sVar4;
  ostream *poVar5;
  Cluster *this_00;
  istream *piVar6;
  Cluster *this_01;
  pointer ppCVar7;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint local_2cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string line;
  uint local_260;
  string word;
  ifstream in;
  
  poVar5 = std::operator<<((ostream *)&std::cerr,"Reading clusters from ");
  poVar5 = std::operator<<(poVar5,(string *)cluster_file);
  std::operator<<(poVar5," ...\n");
  std::ifstream::ifstream(&in,(string *)cluster_file,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (Cluster *)operator_new(0xb8);
  Cluster::Cluster(this_00);
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&line);
    sVar4 = line._M_string_length;
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      std::operator<<((ostream *)&std::cerr,"Done reading clusters.\n");
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&in);
      return this_00;
    }
    if (path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar13 = line._M_string_length & 0xffffffff;
    uVar8 = 0;
    uVar12 = 0;
    do {
      local_260 = (uint)sVar4;
      puVar10 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      this_01 = this_00;
      puVar3 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_260 <= uVar8) goto LAB_0025f730;
      uVar12 = (ulong)uVar8;
      do {
        uVar8 = uVar8 + 1;
        pcVar1 = line._M_dataplus._M_p + uVar12;
        uVar11 = uVar12 + 1;
        if (uVar13 <= uVar12) break;
        uVar12 = uVar11;
      } while (*pcVar1 == ' ' || *pcVar1 == '\t');
      for (lVar9 = -1;
          ((uVar12 = lVar9 + uVar11, uVar12 < uVar13 &&
           (line._M_dataplus._M_p[lVar9 + uVar11] != '\t')) &&
          (line._M_dataplus._M_p[lVar9 + uVar11] != ' ')); lVar9 = lVar9 + 1) {
        uVar8 = uVar8 + 1;
      }
      std::__cxx11::string::substr((ulong)&word,(ulong)&line);
      local_2cc = Dict::Convert(&this->path_symbols,&word);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&path,&local_2cc);
      cVar2 = line._M_dataplus._M_p[lVar9 + uVar11];
      std::__cxx11::string::~string((string *)&word);
    } while (cVar2 == ' ');
    uVar12 = uVar11 + lVar9;
    puVar10 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
LAB_0025f730:
    for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      this_01 = Cluster::add_child(this_01,*puVar10);
    }
    uVar12 = uVar12 & 0xffffffff;
    do {
      pcVar1 = line._M_dataplus._M_p + uVar12;
      uVar11 = uVar12 + 1;
      if (uVar13 <= uVar12) break;
      uVar12 = uVar11;
    } while (*pcVar1 == ' ' || *pcVar1 == '\t');
    for (lVar9 = -1;
        ((uVar11 + lVar9 < uVar13 && (line._M_dataplus._M_p[lVar9 + uVar11] != '\t')) &&
        (line._M_dataplus._M_p[lVar9 + uVar11] != ' ')); lVar9 = lVar9 + 1) {
    }
    std::__cxx11::string::substr((ulong)&word,(ulong)&line);
    uVar8 = Dict::Convert(word_dict,&word);
    Cluster::add_word(this_01,uVar8);
    ppCVar7 = (this->widx2path).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->widx2path).
                      super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar7 >> 3) <= (ulong)uVar8) {
      std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::resize
                (&this->widx2path,(ulong)(uVar8 + 1));
      ppCVar7 = (this->widx2path).
                super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    ppCVar7[uVar8] = this_01;
    std::__cxx11::string::~string((string *)&word);
  } while( true );
}

Assistant:

Cluster* HierarchicalSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  vector<unsigned> path;
  Cluster* root = new Cluster();
  while(getline(in, line)) {
    path.clear();
    ++wc;
    const unsigned len = line.size();
    unsigned startp = 0;
    unsigned endp = 0;
    while (startp < len) {
      while (is_ws(line[startp]) && startp < len) { ++startp; }
      endp = startp;
      while (not_ws(line[endp]) && endp < len) { ++endp; }
      string symbol = line.substr(startp, endp - startp);
      path.push_back(path_symbols.Convert(symbol));
      if (line[endp] == ' ') {
        startp = endp + 1;
        continue;
      }
      else {
        break;
      }
    }
    Cluster* node = root;
    for (unsigned symbol : path) {
      node = node->add_child(symbol);
    }

    unsigned startw = endp;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endp > startp);
    assert(startw > endp);
    assert(endw > startw);

    string word = line.substr(startw, endw - startw);
    unsigned widx = word_dict->Convert(word);
    node->add_word(widx);

    if (widx2path.size() <= widx) {
      widx2path.resize(widx + 1);
    }
    widx2path[widx] = node;
  }
  cerr << "Done reading clusters.\n";
  return root;
}